

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

int __thiscall
boost::unit_test::decorator::precondition::clone
          (precondition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  precondition *p;
  self_type *in_stack_ffffffffffffff98;
  precondition *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  
  this_00 = this;
  p = (precondition *)operator_new(0x28);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  function<boost::test_tools::assertion_result_(unsigned_long)>::function
            ((function<boost::test_tools::assertion_result_(unsigned_long)> *)this_00,
             in_stack_ffffffffffffff98);
  precondition((precondition *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(predicate_t *)p);
  shared_ptr<boost::unit_test::decorator::base>::
  shared_ptr<boost::unit_test::decorator::precondition>
            ((shared_ptr<boost::unit_test::decorator::base> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar1) & 0xffffffff00ffffff),p);
  function<boost::test_tools::assertion_result_(unsigned_long)>::~function
            ((function<boost::test_tools::assertion_result_(unsigned_long)> *)0x24850f);
  return (int)this;
}

Assistant:

virtual base_ptr        clone() const { return base_ptr(new precondition( m_precondition )); }